

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O2

void __thiscall CGL::Application::scroll_event(Application *this,float offset_x,float offset_y)

{
  update_style(this);
  if ((this->mode & ~VISUALIZE_MODE) == EDIT_MODE) {
    CGL::Camera::move_forward((double)-offset_y * this->scroll_rate);
    return;
  }
  return;
}

Assistant:

void Application::scroll_event(float offset_x, float offset_y) {

  update_style();

  switch(mode) {
    case EDIT_MODE:
    case VISUALIZE_MODE:
      camera.move_forward(-offset_y * scroll_rate);
      break;
    case RENDER_MODE:
      break;
  }
}